

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BadExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BadExpressionSyntax,slang::syntax::BadExpressionSyntax_const&>
          (BumpAllocator *this,BadExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  BadExpressionSyntax *pBVar5;
  
  pBVar5 = (BadExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BadExpressionSyntax *)this->endPtr < pBVar5 + 1) {
    pBVar5 = (BadExpressionSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pBVar5 + 1);
  }
  SVar3 = (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pEVar2 = (args->expr).ptr;
  (pBVar5->super_ExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  (pBVar5->expr).ptr = pEVar2;
  (pBVar5->super_ExpressionSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pBVar5->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pBVar5->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pBVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }